

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9DeepSyn(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Gia_Man_t *pNew;
  char *pcVar4;
  uint fVerbose;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_40 = 0;
  Extra_UtilGetoptReset();
  local_44 = 0;
  local_3c = 0;
  fVerbose = 0;
  do {
    while (iVar2 = Extra_UtilGetopt(argc,argv,"TASvh"), iVar1 = globalUtilOptind, iVar2 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar2 < 0x53) {
      if (iVar2 == -1) {
        if (pAbc->pGia != (Gia_Man_t *)0x0) {
          pNew = Gia_ManDeepSyn(pAbc->pGia,local_40,local_44,local_3c,fVerbose);
          Abc_FrameUpdateGia(pAbc,pNew);
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9DeepSyn(): There is no AIG.\n");
        return 0;
      }
      if (iVar2 != 0x41) goto LAB_00291650;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-A\" should be followed by an integer.\n";
        goto LAB_00291644;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_44 = uVar3;
    }
    else if (iVar2 == 0x53) {
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
        goto LAB_00291644;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_3c = uVar3;
    }
    else {
      if (iVar2 != 0x54) goto LAB_00291650;
      if (argc <= globalUtilOptind) {
        pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
LAB_00291644:
        Abc_Print(-1,pcVar4);
        goto LAB_00291650;
      }
      uVar3 = atoi(argv[globalUtilOptind]);
      local_40 = uVar3;
    }
    globalUtilOptind = iVar1 + 1;
    if ((int)uVar3 < 0) {
LAB_00291650:
      Abc_Print(-2,"usage: &deepsyn [-TAS <num>] [-vh]\n");
      Abc_Print(-2,"\t           performs synthesis\n");
      Abc_Print(-2,"\t-T <num> : the timeout in seconds (0 = no timeout) [default = %d]\n",
                (ulong)local_40);
      Abc_Print(-2,"\t-A <num> : the number of nodes to stop (0 = no limit) [default = %d]\n",
                (ulong)local_44);
      Abc_Print(-2,"\t-S <num> : user-specified random seed (0 <= num <= 100) [default = %d]\n",
                (ulong)local_3c);
      pcVar4 = "yes";
      if (fVerbose == 0) {
        pcVar4 = "no";
      }
      Abc_Print(-2,"\t-v       : toggle printing optimization summary [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9DeepSyn( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDeepSyn( Gia_Man_t * pGia, int TimeOut, int nAnds, int Seed, int fVerbose );
    Gia_Man_t * pTemp; int c, TimeOut = 0, nAnds = 0, Seed = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "TASvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( TimeOut < 0 )
                goto usage;
            break;
        case 'A':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-A\" should be followed by an integer.\n" );
                goto usage;
            }
            nAnds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nAnds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            Seed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Seed < 0 )
                goto usage;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9DeepSyn(): There is no AIG.\n" );
        return 0;
    }
    pTemp = Gia_ManDeepSyn( pAbc->pGia, TimeOut, nAnds, Seed, fVerbose );
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &deepsyn [-TAS <num>] [-vh]\n" );
    Abc_Print( -2, "\t           performs synthesis\n" );
    Abc_Print( -2, "\t-T <num> : the timeout in seconds (0 = no timeout) [default = %d]\n",    TimeOut );
    Abc_Print( -2, "\t-A <num> : the number of nodes to stop (0 = no limit) [default = %d]\n", nAnds   );
    Abc_Print( -2, "\t-S <num> : user-specified random seed (0 <= num <= 100) [default = %d]\n", Seed   );
    Abc_Print( -2, "\t-v       : toggle printing optimization summary [default = %s]\n",       fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}